

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O1

double __thiscall chrono::ChSolverADMM::_SolveFast(ChSolverADMM *this,ChSystemDescriptor *sysd)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  _func_int **pp_Var5;
  ChSparseMatrix *pCVar6;
  size_t sVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChConstraint *pCVar13;
  element_type *peVar14;
  StorageIndex *pSVar15;
  Index IVar16;
  Index IVar17;
  StorageIndex *pSVar18;
  Scalar *pSVar19;
  StorageIndex *pSVar20;
  Index IVar21;
  Index IVar22;
  double *pdVar23;
  double *pdVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  _func_int *p_Var30;
  _func_int *p_Var31;
  _func_int *p_Var32;
  _func_int *p_Var33;
  _func_int *p_Var34;
  _func_int *p_Var35;
  _func_int *p_Var36;
  _func_int **pp_Var37;
  undefined8 uVar38;
  uint uVar39;
  uint nrows;
  Index size;
  pointer ppCVar40;
  Scalar *pSVar41;
  ChLog *pCVar42;
  ChStreamOutAscii *pCVar43;
  Index dstRows;
  char *pcVar44;
  uint uVar45;
  Index index;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  pointer ppCVar51;
  int iVar52;
  ulong uVar53;
  Index index_13;
  long lVar54;
  ActualDstType actualDst;
  int iVar55;
  long rows;
  ActualDstType actualDst_2;
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  double __tmp;
  Scalar SVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar71 [64];
  undefined1 auVar63 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar67 [16];
  undefined1 auVar74 [64];
  undefined1 auVar68 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  double __tmp_2;
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  double local_460;
  ChVectorDynamic<> l;
  ChVectorDynamic<> y;
  ChVectorDynamic<> z;
  assign_op<double,_double> local_409;
  ChVectorDynamic<> vrho;
  ChVectorDynamic<> S;
  ChVectorDynamic<> l_old;
  double local_3c8;
  double local_3c0;
  ChVectorDynamic<> v;
  ChVectorDynamic<> y_old;
  Scalar local_380;
  double local_378;
  ChSparseMatrix H;
  ChVectorDynamic<> b;
  ChVectorDynamic<double> *local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  ChVectorDynamic<> IS;
  ChVectorDynamic<> B;
  SrcEvaluatorType srcEvaluator;
  ChVectorDynamic<> v_old;
  double local_290;
  double __tmp_1;
  undefined1 local_278 [16];
  assign_op<double,_double> *local_268;
  ChSparseMatrix *local_260;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_258;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_250;
  evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_248;
  evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_240;
  ChVectorDynamic<> vsigma;
  ChVectorDynamic<> z_old;
  ChVectorDynamic<> k;
  ChSparseMatrix A;
  ChSparseMatrix Cq;
  DstEvaluatorType dstEvaluator;
  ChSparsityPatternLearner sparsity_pattern;
  ChSparseMatrix E;
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  
  __tmp_1 = this->rho;
  uVar39 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  uVar53 = (ulong)uVar39;
  nrows = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  lVar49 = (long)(int)nrows;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar49);
  if (uVar39 == 0) {
    H._8_8_ = H._8_8_ & 0xffffffffffffff00;
    H._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
    H.m_outerSize = 0;
    H.m_innerSize = 0;
    H.m_outerIndex = (StorageIndex *)0x0;
    H.m_innerNonZeros = (StorageIndex *)0x0;
    H.m_data.m_values = (Scalar *)0x0;
    H.m_data.m_indices = (StorageIndex *)0x0;
    H.m_data.m_size = 0;
    H.m_data.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize(&H,lVar49,lVar49);
    Cq._vptr_SparseMatrix = (_func_int **)0x0;
    Cq.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)0x0;
    Cq._9_7_ = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Cq,lVar49);
    lVar49 = std::chrono::_V2::system_clock::now();
    ChSparsityPatternLearner::ChSparsityPatternLearner(&sparsity_pattern,nrows,nrows);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,&H);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&H,&Cq);
    peVar14 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (H.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
        super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue == true) {
      pSVar15 = (peVar14->m_mat).m_outerIndex;
      (peVar14->m_mat).m_outerIndex = H.m_outerIndex;
      IVar16 = (peVar14->m_mat).m_innerSize;
      (peVar14->m_mat).m_innerSize = H.m_innerSize;
      IVar17 = (peVar14->m_mat).m_outerSize;
      (peVar14->m_mat).m_outerSize = H.m_outerSize;
      pSVar18 = (peVar14->m_mat).m_innerNonZeros;
      (peVar14->m_mat).m_innerNonZeros = H.m_innerNonZeros;
      pSVar19 = (peVar14->m_mat).m_data.m_values;
      (peVar14->m_mat).m_data.m_values = H.m_data.m_values;
      pSVar20 = (peVar14->m_mat).m_data.m_indices;
      (peVar14->m_mat).m_data.m_indices = H.m_data.m_indices;
      IVar21 = (peVar14->m_mat).m_data.m_size;
      (peVar14->m_mat).m_data.m_size = H.m_data.m_size;
      IVar22 = (peVar14->m_mat).m_data.m_allocatedSize;
      (peVar14->m_mat).m_data.m_allocatedSize = H.m_data.m_allocatedSize;
      H.m_outerSize = IVar17;
      H.m_innerSize = IVar16;
      H.m_outerIndex = pSVar15;
      H.m_innerNonZeros = pSVar18;
      H.m_data.m_values = pSVar19;
      H.m_data.m_indices = pSVar20;
      H.m_data.m_size = IVar21;
      H.m_data.m_allocatedSize = IVar22;
    }
    else {
      pCVar6 = &peVar14->m_mat;
      if (pCVar6 != &H) {
        Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
                  ((SparseMatrix<double,1,int> *)pCVar6,&H);
        if (H.m_innerNonZeros == (StorageIndex *)0x0) {
          sVar7 = (peVar14->m_mat).m_outerSize * 4 + 4;
          if (sVar7 != 0) {
            memcpy((peVar14->m_mat).m_outerIndex,H.m_outerIndex,sVar7);
          }
          Eigen::internal::CompressedStorage<double,_int>::operator=
                    (&(peVar14->m_mat).m_data,&H.m_data);
        }
        else {
          Eigen::internal::
          assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseMatrix<double,1,int>>
                    (pCVar6,&H);
        }
      }
    }
    uVar38 = Cq._8_8_;
    pp_Var37 = Cq._vptr_SparseMatrix;
    peVar14 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar14->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != Cq._8_8_) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(peVar14->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 Cq._8_8_,1);
    }
    uVar53 = (peVar14->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (uVar53 == uVar38) {
      pdVar24 = (peVar14->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      uVar46 = uVar53 + 7;
      if (-1 < (long)uVar53) {
        uVar46 = uVar53;
      }
      uVar46 = uVar46 & 0xfffffffffffffff8;
      if (7 < (long)uVar53) {
        lVar54 = 0;
        do {
          pp_Var5 = pp_Var37 + lVar54;
          p_Var30 = pp_Var5[1];
          p_Var31 = pp_Var5[2];
          p_Var32 = pp_Var5[3];
          p_Var33 = pp_Var5[4];
          p_Var34 = pp_Var5[5];
          p_Var35 = pp_Var5[6];
          p_Var36 = pp_Var5[7];
          pdVar23 = pdVar24 + lVar54;
          *pdVar23 = (double)*pp_Var5;
          pdVar23[1] = (double)p_Var30;
          pdVar23[2] = (double)p_Var31;
          pdVar23[3] = (double)p_Var32;
          pdVar23[4] = (double)p_Var33;
          pdVar23[5] = (double)p_Var34;
          pdVar23[6] = (double)p_Var35;
          pdVar23[7] = (double)p_Var36;
          lVar54 = lVar54 + 8;
        } while (lVar54 < (long)uVar46);
      }
      if ((long)uVar46 < (long)uVar53) {
        do {
          pdVar24[uVar46] = (double)pp_Var37[uVar46];
          uVar46 = uVar46 + 1;
        } while (uVar53 != uVar46);
      }
      std::chrono::_V2::system_clock::now();
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar42 = GetLog();
        pCVar43 = ChStreamOutAscii::operator<<
                            (&pCVar42->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
        lVar54 = std::chrono::_V2::system_clock::now();
        pCVar43 = ChStreamOutAscii::operator<<(pCVar43,(double)(lVar54 - lVar49) / 1000000000.0);
        ChStreamOutAscii::operator<<(pCVar43,"s\n");
      }
      (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
      (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
      (*sysd->_vptr_ChSystemDescriptor[0x11])
                (sysd,&((this->LS_solver).
                        super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_sol);
      ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
      if (Cq._vptr_SparseMatrix != (_func_int **)0x0) {
        free(Cq._vptr_SparseMatrix[-1]);
      }
      H._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
      free(H.m_outerIndex);
      free(H.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&H.m_data);
      local_460 = 0.0;
      goto LAB_007e274e;
    }
  }
  else {
    rows = (long)(int)uVar39;
    Cq._8_8_ = Cq._8_8_ & 0xffffffffffffff00;
    Cq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
    Cq.m_outerSize = 0;
    Cq.m_innerSize = 0;
    Cq.m_outerIndex = (StorageIndex *)0x0;
    Cq.m_innerNonZeros = (StorageIndex *)0x0;
    Cq.m_data.m_values = (Scalar *)0x0;
    Cq.m_data.m_indices = (StorageIndex *)0x0;
    Cq.m_data.m_size = 0;
    Cq.m_data.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize(&Cq,rows,lVar49);
    E.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
    E._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
    E.m_outerSize = 0;
    E.m_innerSize = 0;
    E.m_outerIndex = (StorageIndex *)0x0;
    E.m_innerNonZeros = (StorageIndex *)0x0;
    E.m_data.m_values = (Scalar *)0x0;
    E.m_data.m_indices = (StorageIndex *)0x0;
    E.m_data.m_size = 0;
    E.m_data.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize(&E,rows,rows);
    k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar49);
    b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    iVar55 = nrows + uVar39;
    lVar54 = (long)iVar55;
    A.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
    A._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
    A.m_outerSize = 0;
    A.m_innerSize = 0;
    A.m_outerIndex = (StorageIndex *)0x0;
    A.m_innerNonZeros = (StorageIndex *)0x0;
    A.m_data.m_values = (Scalar *)0x0;
    A.m_data.m_indices = (StorageIndex *)0x0;
    A.m_data.m_size = 0;
    A.m_data.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize(&A,lVar54,lVar54);
    B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar54);
    l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar49);
    (*sysd->_vptr_ChSystemDescriptor[0x1b])(sysd,&Cq,0,&E,&k,&b,0,0,0);
    Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&Cq);
    Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&E);
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
      goto LAB_007e2bd5;
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
        memset(l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
               l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3);
      }
      if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
      goto LAB_007e2bd5;
      if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
        memset(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
               z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3);
      }
      if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
      goto LAB_007e2bd5;
      if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
        memset(y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
               y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3);
      }
      if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
      goto LAB_007e2bd5;
      if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
        memset(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
               v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3);
      }
    }
    else {
      (*sysd->_vptr_ChSystemDescriptor[0x12])(sysd,&l,0);
      (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,&v,0);
      if ((Cq.m_innerSize !=
           v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) ||
         (E.m_innerSize !=
          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)) {
        pcVar44 = 
        "Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<double, 1>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
        ;
        goto LAB_007e2895;
      }
      if (Cq.m_outerSize != E.m_outerSize) {
        pcVar44 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_007e2b16;
      }
      if (E.m_outerSize !=
          b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar44 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_007e2b16;
      }
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerNonZeros = (StorageIndex *)&l;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize = (Index)&Cq;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerSize = (Index)&v;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerIndex = (StorageIndex *)&E;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_data.m_indices = (StorageIndex *)&b;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::internal::assign_op<double,double>>
                (&y,(CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&sparsity_pattern,(assign_op<double,_double> *)&H);
      IVar16 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      pdVar24 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ,1);
      }
      if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          IVar16) goto LAB_007e2844;
      uVar46 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 7
      ;
      if (-1 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar46 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar46 = uVar46 & 0xfffffffffffffff8;
      if (7 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar50 = 0;
        do {
          pdVar23 = pdVar24 + lVar50;
          dVar78 = pdVar23[1];
          dVar8 = pdVar23[2];
          dVar9 = pdVar23[3];
          dVar26 = pdVar23[4];
          dVar27 = pdVar23[5];
          dVar28 = pdVar23[6];
          dVar29 = pdVar23[7];
          pdVar1 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + lVar50;
          *pdVar1 = *pdVar23;
          pdVar1[1] = dVar78;
          pdVar1[2] = dVar8;
          pdVar1[3] = dVar9;
          pdVar1[4] = dVar26;
          pdVar1[5] = dVar27;
          pdVar1[6] = dVar28;
          pdVar1[7] = dVar29;
          lVar50 = lVar50 + 8;
        } while (lVar50 < (long)uVar46);
      }
      if ((long)uVar46 <
          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar46]
               = pdVar24[uVar46];
          uVar46 = uVar46 + 1;
        } while (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar46);
      }
    }
    S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    if (this->precond == true) {
      ppCVar40 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((sysd->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_finish == ppCVar40) {
        uVar46 = 0;
      }
      else {
        uVar47 = 0;
        uVar48 = 1;
        do {
          (*ppCVar40[uVar47]->_vptr_ChConstraint[6])();
          ppCVar40 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          uVar46 = (long)(sysd->vconstraints).
                         super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar40 >> 3;
          bVar25 = uVar48 < uVar46;
          uVar47 = uVar48;
          uVar48 = (ulong)((int)uVar48 + 1);
        } while (bVar25);
      }
      if (uVar46 != 0) {
        iVar52 = 0;
        uVar45 = 1;
        ppCVar51 = ppCVar40;
        do {
          pCVar13 = *ppCVar51;
          if (pCVar13->mode == CONSTRAINT_FRIC) {
            (&sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix)[iVar52] =
                 (_func_int **)pCVar13->g_i;
            iVar52 = iVar52 + 1;
            if (iVar52 == 3) {
              dVar78 = ((double)sparsity_pattern.super_SparseMatrix<double,_1,_int>.
                                _vptr_SparseMatrix +
                        (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>._8_8_ +
                       (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize) /
                       3.0;
              ppCVar40[uVar45 - 3]->g_i = dVar78;
              ppCVar40[uVar45 - 2]->g_i = dVar78;
              pCVar13->g_i = dVar78;
              iVar52 = 0;
            }
          }
          uVar47 = (ulong)uVar45;
          ppCVar51 = ppCVar51 + 1;
          uVar45 = uVar45 + 1;
        } while (uVar47 < uVar46);
      }
      if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
      goto LAB_007e2bd5;
      if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
        memset(S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
               S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3);
      }
      ppCVar40 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((sysd->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppCVar40) {
        iVar52 = 0;
        uVar46 = 0;
        uVar47 = 1;
        do {
          if (ppCVar40[uVar46]->active == true) {
            dVar78 = ppCVar40[uVar46]->g_i;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = dVar78;
            if (dVar78 < 0.0) {
              dVar78 = sqrt(dVar78);
            }
            else {
              auVar59 = vsqrtsd_avx(auVar59,auVar59);
              dVar78 = auVar59._0_8_;
            }
            if ((iVar52 < 0) ||
               (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
                iVar52)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [iVar52] = dVar78;
            iVar52 = iVar52 + 1;
          }
          ppCVar40 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar25 = uVar47 < (ulong)((long)(sysd->vconstraints).
                                          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppCVar40 >> 3);
          uVar46 = uVar47;
          uVar47 = (ulong)((int)uVar47 + 1);
        } while (bVar25);
      }
      if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      goto LAB_007e2c2b;
      if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
LAB_007e2c45:
        pcVar44 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
        ;
        goto LAB_007e2859;
      }
      uVar46 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 7
      ;
      if (-1 < b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar46 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar46 = uVar46 & 0xfffffffffffffff8;
      if (7 < b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar50 = 0;
        do {
          auVar56 = vmulpd_avx512f(*(undefined1 (*) [64])
                                    (b.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar50),
                                   *(undefined1 (*) [64])
                                    (S.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar50));
          *(undefined1 (*) [64])
           (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar50) = auVar56;
          lVar50 = lVar50 + 8;
        } while (lVar50 < (long)uVar46);
      }
      if ((long)uVar46 <
          b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar46]
               = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar46] *
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar46];
          uVar46 = uVar46 + 1;
        } while (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar46);
      }
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
LAB_007e2866:
        pcVar44 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
LAB_007e2b16:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar44);
      }
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar46 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
                 7;
        if (-1 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        {
          uVar46 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
        }
        uVar46 = uVar46 & 0xfffffffffffffff8;
        if (7 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          lVar50 = 0;
          do {
            auVar56 = vdivpd_avx512f(*(undefined1 (*) [64])
                                      (l.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar50),
                                     *(undefined1 (*) [64])
                                      (S.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar50));
            *(undefined1 (*) [64])
             (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar50) = auVar56;
            lVar50 = lVar50 + 8;
          } while (lVar50 < (long)uVar46);
        }
        if ((long)uVar46 <
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          do {
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar46] = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar46] /
                       S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar46];
            uVar46 = uVar46 + 1;
          } while (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   != uVar46);
        }
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        goto LAB_007e2866;
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          uVar46 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   + 7;
          if (-1 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ) {
            uVar46 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          uVar46 = uVar46 & 0xfffffffffffffff8;
          if (7 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            lVar50 = 0;
            do {
              auVar56 = vdivpd_avx512f(*(undefined1 (*) [64])
                                        (z.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar50),
                                       *(undefined1 (*) [64])
                                        (S.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar50));
              *(undefined1 (*) [64])
               (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               lVar50) = auVar56;
              lVar50 = lVar50 + 8;
            } while (lVar50 < (long)uVar46);
          }
          if ((long)uVar46 <
              z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            do {
              z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar46] = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar46] /
                         S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar46];
              uVar46 = uVar46 + 1;
            } while (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows != uVar46);
          }
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007e2c2b;
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
              S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            uVar46 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows + 7;
            if (-1 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows) {
              uVar46 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
            }
            uVar46 = uVar46 & 0xfffffffffffffff8;
            if (7 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows) {
              lVar50 = 0;
              do {
                auVar56 = vmulpd_avx512f(*(undefined1 (*) [64])
                                          (y.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data + lVar50),
                                         *(undefined1 (*) [64])
                                          (S.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data + lVar50));
                *(undefined1 (*) [64])
                 (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 + lVar50) = auVar56;
                lVar50 = lVar50 + 8;
              } while (lVar50 < (long)uVar46);
            }
            if ((long)uVar46 <
                y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
              do {
                y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                [uVar46] = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[uVar46] *
                           S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[uVar46];
                uVar46 = uVar46 + 1;
              } while (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows != uVar46);
            }
            goto LAB_007e03d9;
          }
          goto LAB_007e2c45;
        }
      }
      pcVar44 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
      ;
      goto LAB_007e2859;
    }
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007e2bd5;
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      lVar50 = 0;
      do {
        *(undefined8 *)
         ((long)S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
         lVar50) = 0x3ff0000000000000;
        lVar50 = lVar50 + 8;
      } while (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3 != lVar50);
    }
LAB_007e03d9:
    vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    {
LAB_007e2bd5:
      pcVar44 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
LAB_007e2bea:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar44);
    }
    if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0)
    {
      dVar78 = this->sigma;
      lVar50 = 0;
      do {
        *(double *)
         ((long)vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data + lVar50) = dVar78;
        lVar50 = lVar50 + 8;
      } while (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows << 3 != lVar50);
    }
    vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007e2bd5;
    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      lVar50 = 0;
      do {
        *(double *)
         ((long)vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         + lVar50) = __tmp_1;
        lVar50 = lVar50 + 8;
      } while (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               * 8 - lVar50 != 0);
    }
    ppCVar40 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    lVar50 = (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar40;
    if (lVar50 != 0) {
      uVar46 = 0;
      uVar45 = 1;
      iVar52 = 0;
      do {
        pCVar13 = ppCVar40[uVar46];
        if (pCVar13->active == true) {
          if (pCVar13->mode == CONSTRAINT_LOCK) {
            if ((iVar52 < 0) ||
               (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                <= iVar52)) goto LAB_007e2a71;
            vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [iVar52] = this->rho_b;
          }
          iVar52 = iVar52 + 1;
        }
        uVar46 = (ulong)uVar45;
        uVar45 = uVar45 + 1;
      } while (uVar46 < (ulong)(lVar50 >> 3));
    }
    lVar50 = std::chrono::_V2::system_clock::now();
    Eigen::SparseMatrix<double,_1,_int>::resize
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_mat,lVar54,lVar54);
    ChSparsityPatternLearner::ChSparsityPatternLearner(&sparsity_pattern,iVar55,iVar55);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,&A);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&A,&B);
    if (this->precond == true) {
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar54);
      if ((int)nrows < 0) goto LAB_007e2bd5;
      local_2f0 = 0;
      local_2e8 = 1;
      local_2f8 = &IS;
      local_2e0 = lVar49;
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          lVar49) {
        pcVar44 = 
        "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
        ;
LAB_007e29cd:
        local_2e8 = 1;
        local_2f0 = 0;
        __assert_fail("m_xpr.rows() >= other.rows() && m_xpr.cols() >= other.cols() && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x2f,pcVar44);
      }
      local_260 = &H;
      H._vptr_SparseMatrix =
           (_func_int **)
           IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      H.m_outerSize = 1;
      H.m_outerIndex = (StorageIndex *)0x0;
      H.m_innerNonZeros = (StorageIndex *)0x0;
      H.m_data.m_values =
           (Scalar *)
           IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_278._8_8_ = &srcEvaluator;
      srcEvaluator.m_functor.m_other = 1.0;
      local_278._0_8_ = &dstEvaluator;
      dstEvaluator.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
      .m_data = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      dstEvaluator.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
      .m_outerStride.m_value =
           IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_268 = &local_409;
      H._8_8_ = lVar49;
      H.m_innerSize = (Index)&IS;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_278);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2f8,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      if ((local_2e0 + local_2f0 !=
           (local_2f8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows) || (local_2e8 != 1)) {
LAB_007e290e:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          A.m_outerSize) {
        pcVar44 = 
        "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::SparseMatrix<double, 1>, Option = 0]"
        ;
LAB_007e2895:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar44);
      }
      H._vptr_SparseMatrix = (_func_int **)((ulong)H._vptr_SparseMatrix & 0xffffffffffffff00);
      H._8_8_ = H._8_8_ & 0xffffffffffffff00;
      H.m_outerSize = (Index)&IS;
      H.m_innerSize = (Index)&A;
      H.m_outerIndex = (StorageIndex *)&IS;
      if (A.m_innerSize !=
          IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar44 = 
        "Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>, _Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Option = 0]"
        ;
        goto LAB_007e2895;
      }
      Eigen::SparseMatrix<double,1,int>::operator=
                ((SparseMatrix<double,1,int> *)&A,
                 (SparseMatrixBase<Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                  *)&H);
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar44 = 
        "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, 1>, 1>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 1]"
        ;
        goto LAB_007e2895;
      }
      if (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar44 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, 1>, 1>, T1 = double, T2 = double]"
        ;
        goto LAB_007e2859;
      }
      uVar46 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 7
      ;
      if (-1 < B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar46 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar46 = uVar46 & 0xfffffffffffffff8;
      if (7 < B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar54 = 0;
        do {
          auVar56 = vmulpd_avx512f(*(undefined1 (*) [64])
                                    (B.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar54),
                                   *(undefined1 (*) [64])
                                    (IS.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar54));
          *(undefined1 (*) [64])
           (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar54) = auVar56;
          lVar54 = lVar54 + 8;
        } while (lVar54 < (long)uVar46);
      }
      if ((long)uVar46 <
          B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar46]
               = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar46] *
                 B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar46];
          uVar46 = uVar46 + 1;
        } while (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar46);
      }
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
    }
    peVar14 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (A.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
        super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue == true) {
      pSVar15 = (peVar14->m_mat).m_outerIndex;
      (peVar14->m_mat).m_outerIndex = A.m_outerIndex;
      IVar16 = (peVar14->m_mat).m_innerSize;
      (peVar14->m_mat).m_innerSize = A.m_innerSize;
      IVar17 = (peVar14->m_mat).m_outerSize;
      (peVar14->m_mat).m_outerSize = A.m_outerSize;
      pSVar18 = (peVar14->m_mat).m_innerNonZeros;
      (peVar14->m_mat).m_innerNonZeros = A.m_innerNonZeros;
      pSVar19 = (peVar14->m_mat).m_data.m_values;
      (peVar14->m_mat).m_data.m_values = A.m_data.m_values;
      pSVar20 = (peVar14->m_mat).m_data.m_indices;
      (peVar14->m_mat).m_data.m_indices = A.m_data.m_indices;
      IVar21 = (peVar14->m_mat).m_data.m_size;
      (peVar14->m_mat).m_data.m_size = A.m_data.m_size;
      IVar22 = (peVar14->m_mat).m_data.m_allocatedSize;
      (peVar14->m_mat).m_data.m_allocatedSize = A.m_data.m_allocatedSize;
      A.m_outerSize = IVar17;
      A.m_innerSize = IVar16;
      A.m_outerIndex = pSVar15;
      A.m_innerNonZeros = pSVar18;
      A.m_data.m_values = pSVar19;
      A.m_data.m_indices = pSVar20;
      A.m_data.m_size = IVar21;
      A.m_data.m_allocatedSize = IVar22;
    }
    else {
      pCVar6 = &peVar14->m_mat;
      if (pCVar6 != &A) {
        Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
                  ((SparseMatrix<double,1,int> *)pCVar6,&A);
        if (A.m_innerNonZeros == (StorageIndex *)0x0) {
          sVar7 = (peVar14->m_mat).m_outerSize * 4 + 4;
          if (sVar7 != 0) {
            memcpy((peVar14->m_mat).m_outerIndex,A.m_outerIndex,sVar7);
          }
          Eigen::internal::CompressedStorage<double,_int>::operator=
                    (&(peVar14->m_mat).m_data,&A.m_data);
        }
        else {
          Eigen::internal::
          assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseMatrix<double,1,int>>
                    (pCVar6,&A);
        }
      }
    }
    IVar16 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar24 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    peVar14 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar14->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(peVar14->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                );
    }
    uVar46 = (peVar14->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (uVar46 == IVar16) {
      pdVar23 = (peVar14->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      uVar47 = uVar46 + 7;
      if (-1 < (long)uVar46) {
        uVar47 = uVar46;
      }
      uVar47 = uVar47 & 0xfffffffffffffff8;
      if (7 < (long)uVar46) {
        lVar54 = 0;
        do {
          pdVar1 = pdVar24 + lVar54;
          dVar78 = pdVar1[1];
          dVar8 = pdVar1[2];
          dVar9 = pdVar1[3];
          dVar26 = pdVar1[4];
          dVar27 = pdVar1[5];
          dVar28 = pdVar1[6];
          dVar29 = pdVar1[7];
          pdVar2 = pdVar23 + lVar54;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar78;
          pdVar2[2] = dVar8;
          pdVar2[3] = dVar9;
          pdVar2[4] = dVar26;
          pdVar2[5] = dVar27;
          pdVar2[6] = dVar28;
          pdVar2[7] = dVar29;
          lVar54 = lVar54 + 8;
        } while (lVar54 < (long)uVar47);
      }
      if ((long)uVar47 < (long)uVar46) {
        do {
          pdVar23[uVar47] = pdVar24[uVar47];
          uVar47 = uVar47 + 1;
        } while (uVar46 != uVar47);
      }
      if (0 < (int)uVar39) {
        uVar46 = 0;
        do {
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              <= (long)uVar46) {
LAB_007e2a71:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          dVar78 = this->sigma;
          dVar8 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data[uVar46];
          pSVar41 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                              (&((this->LS_solver).
                                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_mat,lVar49 + uVar46,lVar49 + uVar46);
          *pSVar41 = *pSVar41 - (dVar8 + dVar78);
          uVar46 = uVar46 + 1;
        } while (uVar53 != uVar46);
      }
      std::chrono::_V2::system_clock::now();
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose != false) {
        pCVar42 = GetLog();
        pCVar43 = ChStreamOutAscii::operator<<
                            (&pCVar42->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
        lVar54 = std::chrono::_V2::system_clock::now();
        pCVar43 = ChStreamOutAscii::operator<<(pCVar43,(double)(lVar54 - lVar50) / 1000000000.0);
        ChStreamOutAscii::operator<<(pCVar43,"s\n");
      }
      lVar54 = std::chrono::_V2::system_clock::now();
      (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
      std::chrono::_V2::system_clock::now();
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar42 = GetLog();
        pCVar43 = ChStreamOutAscii::operator<<
                            (&pCVar42->super_ChStreamOutAscii," Time for factorize : << ");
        lVar50 = std::chrono::_V2::system_clock::now();
        pCVar43 = ChStreamOutAscii::operator<<(pCVar43,(double)(lVar50 - lVar54) / 1000000000.0);
        ChStreamOutAscii::operator<<(pCVar43,"s\n");
      }
      if (0 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
        uVar45 = 0;
        local_290 = 10000000000.0;
        local_378 = 1.0;
        do {
          IVar16 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
          pdVar24 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data;
          if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows,1);
          }
          IVar17 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
          pdVar23 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data;
          if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != IVar16) goto LAB_007e2844;
          uVar46 = l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows + 7;
          if (-1 < l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows) {
            uVar46 = l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          uVar46 = uVar46 & 0xfffffffffffffff8;
          if (7 < l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows) {
            lVar54 = 0;
            do {
              pdVar1 = pdVar24 + lVar54;
              dVar78 = pdVar1[1];
              dVar8 = pdVar1[2];
              dVar9 = pdVar1[3];
              dVar26 = pdVar1[4];
              dVar27 = pdVar1[5];
              dVar28 = pdVar1[6];
              dVar29 = pdVar1[7];
              pdVar2 = l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar54;
              *pdVar2 = *pdVar1;
              pdVar2[1] = dVar78;
              pdVar2[2] = dVar8;
              pdVar2[3] = dVar9;
              pdVar2[4] = dVar26;
              pdVar2[5] = dVar27;
              pdVar2[6] = dVar28;
              pdVar2[7] = dVar29;
              lVar54 = lVar54 + 8;
            } while (lVar54 < (long)uVar46);
          }
          if ((long)uVar46 <
              l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            do {
              l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar46] = pdVar24[uVar46];
              uVar46 = uVar46 + 1;
            } while (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows != uVar46);
          }
          if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows,1);
          }
          IVar16 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
          pdVar24 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data;
          if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != IVar17) goto LAB_007e2844;
          uVar46 = z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows + 7;
          if (-1 < z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows) {
            uVar46 = z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          uVar46 = uVar46 & 0xfffffffffffffff8;
          if (7 < z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows) {
            lVar54 = 0;
            do {
              pdVar1 = pdVar23 + lVar54;
              dVar78 = pdVar1[1];
              dVar8 = pdVar1[2];
              dVar9 = pdVar1[3];
              dVar26 = pdVar1[4];
              dVar27 = pdVar1[5];
              dVar28 = pdVar1[6];
              dVar29 = pdVar1[7];
              pdVar2 = z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar54;
              *pdVar2 = *pdVar1;
              pdVar2[1] = dVar78;
              pdVar2[2] = dVar8;
              pdVar2[3] = dVar9;
              pdVar2[4] = dVar26;
              pdVar2[5] = dVar27;
              pdVar2[6] = dVar28;
              pdVar2[7] = dVar29;
              lVar54 = lVar54 + 8;
            } while (lVar54 < (long)uVar46);
          }
          if ((long)uVar46 <
              z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            do {
              z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar46] = pdVar23[uVar46];
              uVar46 = uVar46 + 1;
            } while (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows != uVar46);
          }
          if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows,1);
          }
          IVar17 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
          pdVar23 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data;
          if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != IVar16) goto LAB_007e2844;
          uVar46 = y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows + 7;
          if (-1 < y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows) {
            uVar46 = y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          uVar46 = uVar46 & 0xfffffffffffffff8;
          if (7 < y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows) {
            lVar54 = 0;
            do {
              pdVar1 = pdVar24 + lVar54;
              dVar78 = pdVar1[1];
              dVar8 = pdVar1[2];
              dVar9 = pdVar1[3];
              dVar26 = pdVar1[4];
              dVar27 = pdVar1[5];
              dVar28 = pdVar1[6];
              dVar29 = pdVar1[7];
              pdVar2 = y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar54;
              *pdVar2 = *pdVar1;
              pdVar2[1] = dVar78;
              pdVar2[2] = dVar8;
              pdVar2[3] = dVar9;
              pdVar2[4] = dVar26;
              pdVar2[5] = dVar27;
              pdVar2[6] = dVar28;
              pdVar2[7] = dVar29;
              lVar54 = lVar54 + 8;
            } while (lVar54 < (long)uVar46);
          }
          if ((long)uVar46 <
              y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            do {
              y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar46] = pdVar24[uVar46];
              uVar46 = uVar46 + 1;
            } while (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows != uVar46);
          }
          if (v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows,1);
          }
          IVar16 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows;
          pdVar2 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
          pdVar1 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          ;
          pdVar24 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data;
          if (v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != IVar17) goto LAB_007e2844;
          uVar46 = v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows + 7;
          if (-1 < v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows) {
            uVar46 = v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          uVar46 = uVar46 & 0xfffffffffffffff8;
          if (7 < v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows) {
            lVar54 = 0;
            do {
              pdVar3 = pdVar23 + lVar54;
              dVar78 = pdVar3[1];
              dVar8 = pdVar3[2];
              dVar9 = pdVar3[3];
              dVar26 = pdVar3[4];
              dVar27 = pdVar3[5];
              dVar28 = pdVar3[6];
              dVar29 = pdVar3[7];
              pdVar4 = v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar54;
              *pdVar4 = *pdVar3;
              pdVar4[1] = dVar78;
              pdVar4[2] = dVar8;
              pdVar4[3] = dVar9;
              pdVar4[4] = dVar26;
              pdVar4[5] = dVar27;
              pdVar4[6] = dVar28;
              pdVar4[7] = dVar29;
              lVar54 = lVar54 + 8;
            } while (lVar54 < (long)uVar46);
          }
          if ((long)uVar46 <
              v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            do {
              v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar46] = pdVar23[uVar46];
              uVar46 = uVar46 + 1;
            } while (v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows != uVar46);
          }
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007e2866;
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            pcVar44 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
            ;
            goto LAB_007e2b16;
          }
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                       .m_rows,1);
          }
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              IVar16) {
            pcVar44 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
            ;
            goto LAB_007e2859;
          }
          uVar46 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   + 7;
          if (-1 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ) {
            uVar46 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          uVar46 = uVar46 & 0xfffffffffffffff8;
          if (7 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            lVar54 = 0;
            do {
              auVar56 = vdivpd_avx512f(*(undefined1 (*) [64])(pdVar1 + lVar54),
                                       *(undefined1 (*) [64])(pdVar2 + lVar54));
              auVar56 = vaddpd_avx512f(auVar56,*(undefined1 (*) [64])(pdVar24 + lVar54));
              *(undefined1 (*) [64])
               (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               lVar54) = auVar56;
              lVar54 = lVar54 + 8;
            } while (lVar54 < (long)uVar46);
          }
          if ((long)uVar46 <
              z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            do {
              z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar46] = pdVar1[uVar46] / pdVar2[uVar46] + pdVar24[uVar46];
              uVar46 = uVar46 + 1;
            } while (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows != uVar46);
          }
          (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&z);
          if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) {
            pcVar44 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007e2b16;
          }
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            pcVar44 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007e2b16;
          }
          if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            pcVar44 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
            ;
            goto LAB_007e2b16;
          }
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            pcVar44 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007e2b16;
          }
          srcEvaluator.m_functor.m_other = 0.0;
          srcEvaluator._8_8_ = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator,
                     y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1);
          pdVar3 = vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
          pdVar2 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          ;
          pdVar1 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
          pdVar23 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data;
          IVar16 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
          pdVar24 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data;
          if (srcEvaluator._8_8_ !=
              y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator,
                       y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows,1);
          }
          if (srcEvaluator._8_8_ != IVar16) {
            pcVar44 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
            ;
            goto LAB_007e2859;
          }
          uVar46 = srcEvaluator._8_8_ + 7;
          if (-1 < (long)srcEvaluator._8_8_) {
            uVar46 = srcEvaluator._8_8_;
          }
          if (7 < (long)srcEvaluator._8_8_) {
            lVar54 = 0;
            do {
              auVar56 = vsubpd_avx512f(ZEXT864(0) << 0x40,*(undefined1 (*) [64])(pdVar2 + lVar54));
              auVar57 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar3 + lVar54),
                                       *(undefined1 (*) [64])(pdVar1 + lVar54));
              auVar57 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(pdVar23 + lVar54));
              auVar56 = vaddpd_avx512f(auVar56,auVar57);
              auVar56 = vsubpd_avx512f(auVar56,*(undefined1 (*) [64])(pdVar24 + lVar54));
              *(undefined1 (*) [64])((long)srcEvaluator.m_functor.m_other + lVar54 * 8) = auVar56;
              lVar54 = lVar54 + 8;
            } while (lVar54 < (long)(uVar46 & 0xfffffffffffffff8));
          }
          if ((long)(uVar46 & 0xfffffffffffffff8) < (long)srcEvaluator._8_8_) {
            lVar54 = (long)uVar46 >> 3;
            lVar50 = 0;
            do {
              *(double *)((long)srcEvaluator.m_functor.m_other + lVar54 * 0x40 + lVar50 * 8) =
                   ((pdVar3[lVar54 * 8 + lVar50] + pdVar1[lVar54 * 8 + lVar50]) *
                    pdVar23[lVar54 * 8 + lVar50] - pdVar2[lVar54 * 8 + lVar50]) -
                   pdVar24[lVar54 * 8 + lVar50];
              lVar50 = lVar50 + 1;
            } while ((long)srcEvaluator._8_8_ % 8 != lVar50);
          }
          peVar14 = (this->LS_solver).
                    super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_2f8 = &peVar14->m_rhs;
          local_2f0 = 0;
          local_2e8 = 1;
          local_2e0 = k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          pSVar19 = (Scalar *)
                    (peVar14->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
          if ((long)pSVar19 <
              k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            pcVar44 = 
            "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007e29cd;
          }
          H._vptr_SparseMatrix =
               (_func_int **)
               (local_2f8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
          H._8_8_ = k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows;
          H.m_outerSize = 1;
          if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0
              && H._vptr_SparseMatrix != (_func_int **)0x0) {
LAB_007e2996:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                         );
          }
          H.m_outerIndex = (StorageIndex *)0x0;
          H.m_innerNonZeros = (StorageIndex *)0x0;
          H.m_innerSize = (Index)local_2f8;
          H.m_data.m_values = pSVar19;
          if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
          {
LAB_007e2974:
            __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                          "Eigen::Block<Eigen::Matrix<double, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                         );
          }
          IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          local_278._0_8_ = &dstEvaluator;
          local_278._8_8_ = &IS;
          local_268 = &local_409;
          auVar59 = SUB6416(ZEXT864(0),0) << 0x40;
          local_260 = &H;
          dstEvaluator.
          super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
          .m_data = (PointerType)H._vptr_SparseMatrix;
          dstEvaluator.
          super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
          .m_outerStride.m_value = (long)pSVar19;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)local_278);
          Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                    ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2f8,
                     (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator);
          if ((local_2e0 + local_2f0 !=
               (local_2f8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_rows) || (local_2e8 != 1)) goto LAB_007e290e;
          lVar54 = std::chrono::_V2::system_clock::now();
          (*(((this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
          std::chrono::_V2::system_clock::now();
          if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
            pCVar42 = GetLog();
            pCVar43 = ChStreamOutAscii::operator<<
                                (&pCVar42->super_ChStreamOutAscii," Time for solve : << ");
            lVar50 = std::chrono::_V2::system_clock::now();
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43,(double)(lVar50 - lVar54) / 1000000000.0)
            ;
            ChStreamOutAscii::operator<<(pCVar43,"s\n");
          }
          peVar14 = (this->LS_solver).
                    super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pdVar24 = (peVar14->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          if (pdVar24 != (double *)0x0 && (int)uVar39 < 0) goto LAB_007e2996;
          if (((int)(nrows | uVar39) < 0) ||
             ((peVar14->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows < rows + lVar49)) goto LAB_007e2974;
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              rows) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows,1);
          }
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              rows) {
            pcVar44 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
            ;
            goto LAB_007e2859;
          }
          uVar46 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   & 0xfffffffffffffff8;
          if (0 < (long)uVar46) {
            lVar54 = 0;
            do {
              auVar56 = vsubpd_avx512f(ZEXT864(0) << 0x40,
                                       *(undefined1 (*) [64])(pdVar24 + lVar49 + lVar54));
              *(undefined1 (*) [64])
               (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               lVar54) = auVar56;
              lVar54 = lVar54 + 8;
            } while (lVar54 < (long)uVar46);
          }
          if (uVar46 != l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows) {
            do {
              auVar60._0_8_ = -pdVar24[lVar49 + uVar46];
              auVar60._8_8_ = 0x8000000000000000;
              dVar78 = (double)vmovlpd_avx(auVar60);
              l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar46] = dVar78;
              uVar46 = uVar46 + 1;
            } while ((long)uVar46 <
                     l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows);
          }
          peVar14 = (this->LS_solver).
                    super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pdVar24 = (peVar14->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          if (pdVar24 != (double *)0x0 && (int)nrows < 0) goto LAB_007e2996;
          if (((int)nrows < 0) ||
             ((peVar14->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows < lVar49)) goto LAB_007e2974;
          if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              lVar49) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar49,1);
          }
          if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              lVar49) {
            pcVar44 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
            ;
            goto LAB_007e2859;
          }
          uVar46 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   & 0xfffffffffffffff8;
          if (0 < (long)uVar46) {
            lVar54 = 0;
            do {
              pdVar23 = pdVar24 + lVar54;
              dVar78 = pdVar23[1];
              dVar8 = pdVar23[2];
              dVar9 = pdVar23[3];
              dVar26 = pdVar23[4];
              dVar27 = pdVar23[5];
              dVar28 = pdVar23[6];
              dVar29 = pdVar23[7];
              pdVar1 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data + lVar54;
              *pdVar1 = *pdVar23;
              pdVar1[1] = dVar78;
              pdVar1[2] = dVar8;
              pdVar1[3] = dVar9;
              pdVar1[4] = dVar26;
              pdVar1[5] = dVar27;
              pdVar1[6] = dVar28;
              pdVar1[7] = dVar29;
              lVar54 = lVar54 + 8;
            } while (lVar54 < (long)uVar46);
          }
          if (uVar46 != v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows) {
            do {
              v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar46] = pdVar24[uVar46];
              uVar46 = uVar46 + 1;
            } while ((long)uVar46 <
                     v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows);
          }
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007e2b01;
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            pcVar44 = 
            "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Option = 1]"
            ;
            goto LAB_007e2895;
          }
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            pcVar44 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>]"
            ;
            goto LAB_007e2b16;
          }
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            pcVar44 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>>, T1 = double, T2 = double]"
            ;
            goto LAB_007e2859;
          }
          uVar46 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   + 7;
          if (-1 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ) {
            uVar46 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          uVar46 = uVar46 & 0xfffffffffffffff8;
          if (7 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            lVar54 = 0;
            do {
              auVar56 = vsubpd_avx512f(*(undefined1 (*) [64])
                                        (l.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar54),
                                       *(undefined1 (*) [64])
                                        (z.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar54));
              auVar56 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])
                                                (vrho.
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_data + lVar54));
              auVar56 = vaddpd_avx512f(auVar56,*(undefined1 (*) [64])
                                                (y.
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_data + lVar54));
              *(undefined1 (*) [64])
               (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               lVar54) = auVar56;
              lVar54 = lVar54 + 8;
            } while (lVar54 < (long)uVar46);
          }
          if ((long)uVar46 <
              y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            do {
              y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar46] = (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data[uVar46] -
                         z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar46]) *
                         vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[uVar46] +
                         y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar46];
              uVar46 = uVar46 + 1;
            } while (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows != uVar46);
          }
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007e2b01;
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007e293b;
          if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0
             ) {
            H.m_outerSize = (Index)&z;
            H.m_innerNonZeros = (StorageIndex *)&S;
            H.m_innerSize = (Index)&l;
            if (0 < S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows) {
              local_260 = (ChSparseMatrix *)
                          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data;
              local_258.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              ;
              local_250.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              ;
              dVar78 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                   *)local_278,(scalar_max_op<double,_double,_0> *)&local_2f8,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)&H);
              goto LAB_007e14a6;
            }
LAB_007e2a2c:
            pcVar44 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
            ;
            goto LAB_007e2ab4;
          }
          dVar78 = 0.0;
LAB_007e14a6:
          this->r_prim = dVar78;
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
LAB_007e2b01:
            pcVar44 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007e2b16;
          }
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0
             ) {
            local_3c0 = 0.0;
          }
          else {
            H._8_8_ = &z;
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
                1) {
              pcVar44 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
              ;
              H.m_outerSize = (Index)&l;
              goto LAB_007e2ab4;
            }
            local_268 = (assign_op<double,_double> *)
                        z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_260 = (ChSparseMatrix *)
                        l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            H.m_outerSize = (Index)&l;
            local_3c0 = Eigen::internal::
                        redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                        ::
                        run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                  ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                    *)local_278,(scalar_max_op<double,_double,_0> *)&local_2f8,
                                   (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)&H);
          }
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007e2b01;
          if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) {
LAB_007e293b:
            pcVar44 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007e2b16;
          }
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            pcVar44 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007e2b16;
          }
          if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0
             ) {
            dVar78 = 0.0;
          }
          else {
            H.m_outerIndex = (StorageIndex *)&l_old;
            H.m_data.m_values = (Scalar *)&vrho;
            H.m_data.m_size = (Index)&S;
            if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
                1) {
              pcVar44 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
              ;
              H.m_innerSize = (Index)&l;
              goto LAB_007e2ab4;
            }
            local_258.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            local_250.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
            local_248.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
            local_240.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            H.m_innerSize = (Index)&l;
            dVar78 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_278,(scalar_max_op<double,_double,_0> *)&local_2f8,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&H);
          }
          this->r_dual = dVar78;
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007e2b01;
          if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) goto LAB_007e293b;
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              == 0) {
            local_3c8 = 0.0;
          }
          else {
            H.m_innerSize = (Index)&l_old;
            H.m_innerNonZeros = (StorageIndex *)&vrho;
            H.m_outerSize = (Index)&l;
            if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                < 1) goto LAB_007e2a2c;
            local_260 = (ChSparseMatrix *)
                        l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_258.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
            local_250.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
            local_3c8 = Eigen::internal::
                        redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                        ::
                        run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                  ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                    *)local_278,(scalar_max_op<double,_double,_0> *)&local_2f8,
                                   (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)&H);
          }
          if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
            pCVar42 = GetLog();
            pCVar43 = ChStreamOutAscii::operator<<
                                (&pCVar42->super_ChStreamOutAscii,"ADMMfast iter=");
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43,uVar45);
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43," prim=");
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43,this->r_prim);
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43," dual=");
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43,this->r_dual);
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43,"  rho=");
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43,__tmp_1);
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43," alpha=");
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43,local_378);
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43,"  tols=");
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43,this->tol_prim);
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43," ");
            pCVar43 = ChStreamOutAscii::operator<<(pCVar43,this->tol_dual);
            ChStreamOutAscii::operator<<(pCVar43,"\n");
          }
          if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
            if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) goto LAB_007e2b01;
            dVar78 = this->rho;
            H._8_8_ = &y;
            H.m_outerSize = (Index)&y_old;
            if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows == 0) {
              local_380 = 0.0;
LAB_007e1849:
              if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  != l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows) goto LAB_007e2b01;
              dVar8 = this->rho;
              H.m_outerSize = (Index)&l_old;
              if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows == 0) {
                auVar61 = ZEXT816(0) << 0x40;
                H._8_8_ = (DstEvaluatorType *)&l;
              }
              else {
                H._8_8_ = (DstEvaluatorType *)&l;
                if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) goto LAB_007e2a9f;
                local_268 = (assign_op<double,_double> *)
                            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                local_260 = (ChSparseMatrix *)
                            l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                auVar56._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_278,(scalar_sum_op<double,_double> *)&local_2f8,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&H);
                auVar56._8_56_ = extraout_var;
                auVar61 = auVar56._0_16_;
              }
              if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  != l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows) goto LAB_007e2b01;
              H.m_outerSize = (Index)&l_old;
              if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows == 0) {
                auVar60 = ZEXT816(0) << 0x40;
                H._8_8_ = (DstEvaluatorType *)&l;
              }
              else {
                H._8_8_ = (DstEvaluatorType *)&l;
                if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) goto LAB_007e2a9f;
                local_268 = (assign_op<double,_double> *)
                            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                local_260 = (ChSparseMatrix *)
                            l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                auVar57._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_278,(scalar_sum_op<double,_double> *)&local_2f8,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&H);
                auVar57._8_56_ = extraout_var_00;
                auVar60 = auVar57._0_16_;
                auVar61._8_8_ = 0;
              }
              auVar60 = vsqrtsd_avx(auVar60,auVar60);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = local_380;
              auVar59 = vsqrtsd_avx(auVar59,auVar10);
              auVar61 = vsqrtsd_avx(auVar61,auVar61);
              auVar11._8_8_ = 0;
              auVar11._0_8_ = 1.0 / dVar78;
              auVar62._8_8_ = 0;
              auVar62._0_8_ = auVar61._0_8_ * dVar8;
              auVar59 = vfmadd231sd_fma(auVar62,auVar59,auVar11);
              ChIterativeSolverVI::AtIterationEnd
                        (&this->super_ChIterativeSolverVI,auVar59._0_8_,auVar60._0_8_,uVar45);
              goto LAB_007e1988;
            }
            if (0 < y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows) {
              local_268 = (assign_op<double,_double> *)
                          y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data;
              local_260 = (ChSparseMatrix *)
                          y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data;
              local_380 = Eigen::internal::
                          redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                          ::
                          run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                    ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                      *)local_278,(scalar_sum_op<double,_double> *)&local_2f8,
                                     (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      *)&H);
              goto LAB_007e1849;
            }
LAB_007e2a9f:
            pcVar44 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
            ;
            goto LAB_007e2ab4;
          }
LAB_007e1988:
          if ((this->tol_prim <= this->r_prim) || (this->tol_dual <= this->r_dual)) {
            if (1 < uVar45) {
              if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  != y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows) goto LAB_007e2b01;
              dVar78 = this->rho;
              H._8_8_ = &y;
              H.m_outerSize = (Index)&y_old;
              if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows == 0) {
                auVar63 = ZEXT816(0) << 0x40;
              }
              else {
                if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) goto LAB_007e2a9f;
                local_268 = (assign_op<double,_double> *)
                            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                local_260 = (ChSparseMatrix *)
                            y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                auVar71._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_278,(scalar_sum_op<double,_double> *)&local_2f8,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&H);
                auVar71._8_56_ = extraout_var_01;
                auVar63 = auVar71._0_16_;
              }
              if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  != l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows) goto LAB_007e2b01;
              dVar8 = this->rho;
              H.m_outerSize = (Index)&l_old;
              if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows == 0) {
                auVar59 = ZEXT816(0) << 0x40;
                H._8_8_ = (DstEvaluatorType *)&l;
              }
              else {
                H._8_8_ = (DstEvaluatorType *)&l;
                if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) goto LAB_007e2a9f;
                local_268 = (assign_op<double,_double> *)
                            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                local_260 = (ChSparseMatrix *)
                            l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                auVar72._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_278,(scalar_sum_op<double,_double> *)&local_2f8,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&H);
                auVar72._8_56_ = extraout_var_02;
                auVar59 = auVar72._0_16_;
                auVar63._8_8_ = 0;
              }
              auVar59 = vsqrtsd_avx(auVar59,auVar59);
              auVar60 = vsqrtsd_avx(auVar63,auVar63);
              auVar12._8_8_ = 0;
              auVar12._0_8_ = 1.0 / dVar78;
              auVar64._8_8_ = 0;
              auVar64._0_8_ = dVar8 * auVar59._0_8_;
              auVar59 = vfmadd132sd_fma(auVar60,auVar64,auVar12);
              dVar78 = local_290 * 0.9999;
              local_290 = auVar59._0_8_;
              if (local_290 < dVar78) {
                auVar65._8_8_ = 0;
                auVar65._0_8_ = local_378 * local_378;
                auVar59 = vfmadd213sd_fma(auVar65,ZEXT816(0x4010000000000000),
                                          ZEXT816(0x3ff0000000000000));
                if (auVar59._0_8_ < 0.0) {
                  dVar78 = sqrt(auVar59._0_8_);
                }
                else {
                  auVar59 = vsqrtsd_avx(auVar59,auVar59);
                  dVar78 = auVar59._0_8_;
                }
                dVar78 = (dVar78 + 1.0) * 0.5;
                if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows) goto LAB_007e2b01;
                if (-1 < l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows) {
                  if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows == l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                .m_storage.m_rows) {
                    auVar79._0_8_ = (local_378 + -1.0) / dVar78;
                    auVar79._8_8_ = 0;
                    uVar46 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 7;
                    if (-1 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows) {
                      uVar46 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows;
                    }
                    uVar46 = uVar46 & 0xfffffffffffffff8;
                    if (7 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows) {
                      auVar56 = vbroadcastsd_avx512f(auVar79);
                      lVar54 = 0;
                      do {
                        auVar57 = vsubpd_avx512f(*(undefined1 (*) [64])
                                                  (l.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar54),
                                                 *(undefined1 (*) [64])
                                                  (l_old.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar54));
                        auVar57 = vmulpd_avx512f(auVar56,auVar57);
                        auVar57 = vaddpd_avx512f(*(undefined1 (*) [64])
                                                  (l.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar54),auVar57);
                        *(undefined1 (*) [64])
                         (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data + lVar54) = auVar57;
                        lVar54 = lVar54 + 8;
                      } while (lVar54 < (long)uVar46);
                    }
                    if ((long)uVar46 <
                        l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows) {
                      do {
                        l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data[uVar46] =
                             l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[uVar46] +
                             auVar79._0_8_ *
                             (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data[uVar46] -
                             l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[uVar46]);
                        uVar46 = uVar46 + 1;
                      } while (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows != uVar46);
                    }
                    if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows != v_old.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows) goto LAB_007e2b01;
                    if (v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows < 0) goto LAB_007e2ae7;
                    if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows == v_old.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows) {
                      uVar46 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows + 7;
                      if (-1 < v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows) {
                        uVar46 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows;
                      }
                      uVar46 = uVar46 & 0xfffffffffffffff8;
                      if (7 < v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows) {
                        auVar56 = vbroadcastsd_avx512f(auVar79);
                        lVar54 = 0;
                        do {
                          auVar57 = vsubpd_avx512f(*(undefined1 (*) [64])
                                                    (v.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar54),
                                                  *(undefined1 (*) [64])
                                                   (v_old.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar54));
                          auVar57 = vmulpd_avx512f(auVar56,auVar57);
                          auVar57 = vaddpd_avx512f(*(undefined1 (*) [64])
                                                    (v.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar54),auVar57);
                          *(undefined1 (*) [64])
                           (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data + lVar54) = auVar57;
                          lVar54 = lVar54 + 8;
                        } while (lVar54 < (long)uVar46);
                      }
                      if ((long)uVar46 <
                          v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows) {
                        do {
                          v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data[uVar46] =
                               v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data[uVar46] +
                               auVar79._0_8_ *
                               (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data[uVar46] -
                               v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data[uVar46]);
                          uVar46 = uVar46 + 1;
                        } while (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows != uVar46);
                      }
                      if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows !=
                          y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows) goto LAB_007e2b01;
                      if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows < 0) goto LAB_007e2ae7;
                      if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows ==
                          y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows) {
                        uVar46 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows + 7;
                        if (-1 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows) {
                          uVar46 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows;
                        }
                        uVar46 = uVar46 & 0xfffffffffffffff8;
                        if (7 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows) {
                          auVar56 = vbroadcastsd_avx512f(auVar79);
                          lVar54 = 0;
                          do {
                            auVar57 = vsubpd_avx512f(*(undefined1 (*) [64])
                                                      (y.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar54),
                                                  *(undefined1 (*) [64])
                                                   (y_old.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar54));
                            auVar57 = vmulpd_avx512f(auVar56,auVar57);
                            auVar57 = vaddpd_avx512f(*(undefined1 (*) [64])
                                                      (y.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar54),auVar57);
                            *(undefined1 (*) [64])
                             (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + lVar54) = auVar57;
                            lVar54 = lVar54 + 8;
                          } while (lVar54 < (long)uVar46);
                        }
                        local_378 = dVar78;
                        if ((long)uVar46 <
                            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows) {
                          do {
                            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data[uVar46] =
                                 y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data[uVar46] +
                                 auVar79._0_8_ *
                                 (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data[uVar46] -
                                 y_old.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data[uVar46]);
                            uVar46 = uVar46 + 1;
                          } while (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows != uVar46);
                        }
                        goto LAB_007e1e46;
                      }
                    }
                  }
                  pcVar44 = 
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>, T1 = double, T2 = double]"
                  ;
                  goto LAB_007e2859;
                }
LAB_007e2ae7:
                pcVar44 = 
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                ;
                goto LAB_007e2bea;
              }
              if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true)
              {
                pCVar42 = GetLog();
                pCVar43 = ChStreamOutAscii::operator<<
                                    (&pCVar42->super_ChStreamOutAscii,"ADMMfast Nesterov restart.");
                pCVar43 = ChStreamOutAscii::operator<<(pCVar43,uVar45);
                ChStreamOutAscii::operator<<(pCVar43,"\n");
              }
              local_290 = local_290 * 1.000100010001;
              local_378 = 1.0;
            }
LAB_007e1e46:
            bVar25 = true;
            if ((int)uVar45 % this->stepadjust_each == 0) {
              auVar59 = ZEXT816(0x3ff0000000000000);
              if (this->stepadjust_type == BALANCED_UNSCALED) {
                auVar66._0_8_ = local_3c0 / local_3c8;
                auVar66._8_8_ = 0;
                if (auVar66._0_8_ < 0.0) {
                  auVar73._0_8_ = sqrt(auVar66._0_8_);
                  auVar73._8_56_ = extraout_var_03;
                  auVar59 = auVar73._0_16_;
                }
                else {
                  auVar59 = vsqrtsd_avx(auVar66,auVar66);
                }
              }
              if (this->stepadjust_type == BALANCED_FAST) {
                auVar67 = ZEXT816(0) << 0x40;
                auVar68 = ZEXT816(0) << 0x40;
                if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != 0) {
                  local_278._0_8_ = &z;
                  if (0 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows) {
                    H._8_8_ = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data;
                    auVar74._0_8_ =
                         Eigen::internal::
                         redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                         ::
                         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)&H,(scalar_max_op<double,_double,_0> *)&local_2f8,
                                    (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                     *)local_278);
                    auVar74._8_56_ = extraout_var_04;
                    auVar68 = auVar74._0_16_;
                    auVar67 = ZEXT816(0);
                    goto LAB_007e1f07;
                  }
LAB_007e2b45:
                  pcVar44 = 
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
                  ;
LAB_007e2ab4:
                  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\""
                                ,"/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar44);
                }
LAB_007e1f07:
                auVar80._0_8_ = auVar68._0_8_;
                if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != 0) {
                  local_278._0_8_ = (DstEvaluatorType *)&l;
                  if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows < 1) goto LAB_007e2b45;
                  H._8_8_ = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                  auVar75._0_8_ =
                       Eigen::internal::
                       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)&H,(scalar_max_op<double,_double,_0> *)&local_2f8,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                   *)local_278);
                  auVar75._8_56_ = extraout_var_05;
                  auVar67 = auVar75._0_16_;
                  auVar80._8_8_ = 0;
                  auVar68 = auVar80;
                }
                dVar78 = 1e-10;
                if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != 0) {
                  local_278._0_8_ = &y;
                  if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows < 1) goto LAB_007e2b45;
                  H._8_8_ = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                  SVar58 = Eigen::internal::
                           redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                           ::
                           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&H,(scalar_max_op<double,_double,_0> *)&local_2f8,
                                      (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       *)local_278);
                  dVar78 = SVar58 + 1e-10;
                  auVar67._8_8_ = 0;
                  auVar68._8_8_ = 0;
                  auVar68._0_8_ = auVar80._0_8_;
                }
                auVar59 = vmaxsd_avx(auVar68,auVar67);
                auVar69._0_8_ = (local_3c0 / (auVar59._0_8_ + 1e-10)) / (local_3c8 / dVar78 + 1e-10)
                ;
                auVar69._8_8_ = 0;
                if (auVar69._0_8_ < 0.0) {
                  auVar76._0_8_ = sqrt(auVar69._0_8_);
                  auVar76._8_56_ = extraout_var_06;
                  auVar59 = auVar76._0_16_;
                }
                else {
                  auVar59 = vsqrtsd_avx(auVar69,auVar69);
                }
              }
              if (this->stepadjust_type == BALANCED_RANGE) {
                auVar70._0_8_ =
                     (this->r_prim / this->tol_prim) / (this->r_dual / this->tol_dual + 1e-10);
                auVar70._8_8_ = 0;
                if (auVar70._0_8_ < 0.0) {
                  auVar77._0_8_ = sqrt(auVar70._0_8_);
                  auVar77._8_56_ = extraout_var_07;
                  auVar59 = auVar77._0_16_;
                }
                else {
                  auVar59 = vsqrtsd_avx(auVar70,auVar70);
                }
              }
              auVar81._8_8_ = 0;
              auVar81._0_8_ = this->stepadjust_maxfactor;
              auVar82._0_8_ = 1.0 / this->stepadjust_maxfactor;
              auVar82._8_8_ = 0;
              auVar59 = vmaxsd_avx(auVar82,auVar59);
              auVar59 = vminsd_avx(auVar81,auVar59);
              dVar78 = auVar59._0_8_;
              if ((this->stepadjust_threshold < dVar78) ||
                 (dVar78 < 1.0 / this->stepadjust_threshold)) {
                lVar54 = std::chrono::_V2::system_clock::now();
                if (0 < (int)uVar39) {
                  uVar46 = 0;
                  do {
                    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows <= (long)uVar46) goto LAB_007e2a71;
                    dVar8 = this->sigma;
                    dVar9 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data[uVar46];
                    lVar50 = nrows + uVar46;
                    pSVar41 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                        (&((this->LS_solver).
                                           super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_mat,lVar50,lVar50);
                    *pSVar41 = dVar9 + dVar8 + *pSVar41;
                    uVar46 = uVar46 + 1;
                  } while (uVar53 != uVar46);
                }
                if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 0) goto LAB_007e2bd5;
                __tmp_1 = __tmp_1 * dVar78;
                if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != 0) {
                  lVar50 = 0;
                  do {
                    *(double *)
                     ((long)vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data + lVar50) = __tmp_1;
                    lVar50 = lVar50 + 8;
                  } while (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows * 8 - lVar50 != 0);
                }
                ppCVar40 = (sysd->vconstraints).
                           super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                lVar50 = (long)(sysd->vconstraints).
                               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar40;
                if (lVar50 != 0) {
                  iVar55 = 0;
                  uVar46 = 1;
                  uVar47 = 0;
                  do {
                    uVar48 = uVar46;
                    pCVar13 = ppCVar40[uVar47];
                    if (pCVar13->active == true) {
                      if (pCVar13->mode == CONSTRAINT_LOCK) {
                        if ((iVar55 < 0) ||
                           (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows <= iVar55)) goto LAB_007e2a71;
                        vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data[iVar55] = this->rho_b;
                      }
                      iVar55 = iVar55 + 1;
                    }
                    uVar46 = (ulong)((int)uVar48 + 1);
                    uVar47 = uVar48;
                  } while (uVar48 < (ulong)(lVar50 >> 3));
                }
                if (0 < (int)uVar39) {
                  uVar46 = 0;
                  do {
                    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows <= (long)uVar46) goto LAB_007e2a71;
                    dVar78 = this->sigma;
                    dVar8 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data[uVar46];
                    lVar50 = nrows + uVar46;
                    pSVar41 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                        (&((this->LS_solver).
                                           super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_mat,lVar50,lVar50);
                    *pSVar41 = *pSVar41 - (dVar8 + dVar78);
                    uVar46 = uVar46 + 1;
                  } while (uVar53 != uVar46);
                }
                (*(((this->LS_solver).
                    super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
                std::chrono::_V2::system_clock::now();
                if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose ==
                    true) {
                  pCVar42 = GetLog();
                  pCVar43 = ChStreamOutAscii::operator<<
                                      (&pCVar42->super_ChStreamOutAscii,
                                       " Time for re-factorize : << ");
                  lVar50 = std::chrono::_V2::system_clock::now();
                  pCVar43 = ChStreamOutAscii::operator<<
                                      (pCVar43,(double)(lVar50 - lVar54) / 1000000000.0);
                  ChStreamOutAscii::operator<<(pCVar43,"s\n");
                }
              }
            }
          }
          else {
            if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
              pCVar42 = GetLog();
              pCVar43 = ChStreamOutAscii::operator<<
                                  (&pCVar42->super_ChStreamOutAscii,
                                   "ADMMfast converged ok! at iter=");
              pCVar43 = ChStreamOutAscii::operator<<(pCVar43,uVar45);
              ChStreamOutAscii::operator<<(pCVar43,"\n");
            }
            bVar25 = false;
          }
          if (srcEvaluator.m_functor.m_other != 0.0) {
            free(*(void **)((long)srcEvaluator.m_functor.m_other + -8));
          }
        } while ((bVar25) &&
                (uVar45 = uVar45 + 1,
                (int)uVar45 <
                (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations));
      }
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          uVar53 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   + 7;
          if (-1 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ) {
            uVar53 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          uVar53 = uVar53 & 0xfffffffffffffff8;
          if (7 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            lVar49 = 0;
            do {
              auVar56 = vmulpd_avx512f(*(undefined1 (*) [64])
                                        (l.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar49),
                                       *(undefined1 (*) [64])
                                        (S.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar49));
              *(undefined1 (*) [64])
               (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               lVar49) = auVar56;
              lVar49 = lVar49 + 8;
            } while (lVar49 < (long)uVar53);
          }
          if ((long)uVar53 <
              l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            do {
              l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar53] = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar53] *
                         S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar53];
              uVar53 = uVar53 + 1;
            } while (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows != uVar53);
          }
          (*sysd->_vptr_ChSystemDescriptor[0x13])(sysd,&l);
          (*sysd->_vptr_ChSystemDescriptor[0x11])(sysd,&v);
          local_460 = this->r_dual;
          ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if (v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          A._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
          free(A.m_outerIndex);
          free(A.m_innerNonZeros);
          Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&A.m_data);
          if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          E._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
          free(E.m_outerIndex);
          free(E.m_innerNonZeros);
          Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&E.m_data);
          Cq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
          free(Cq.m_outerIndex);
          free(Cq.m_innerNonZeros);
          Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&Cq.m_data);
LAB_007e274e:
          if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          return local_460;
        }
        goto LAB_007e2c45;
      }
LAB_007e2c2b:
      pcVar44 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_007e2b16;
    }
  }
LAB_007e2844:
  pcVar44 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
  ;
LAB_007e2859:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar44);
}

Assistant:

double ChSolverADMM::_SolveFast(ChSystemDescriptor& sysd) {

    // For Nesterov:
    double nalpha = 1.0; 
    double c_k = 1e10;
    double eta = 0.9999;

    ChTimer<> m_timer_convert;
    ChTimer<> m_timer_factorize;
    ChTimer<> m_timer_solve;

    double rho_i = this->rho;

    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();

    int nc = sysd.CountActiveConstraints();
    int nv = sysd.CountActiveVariables();

    ChVectorDynamic<> v(nv);

    // shortcut for the case of no constraints:
    if (nc == 0) {

        ChSparseMatrix H(nv, nv);
        ChVectorDynamic<> k(nv);


        m_timer_convert.start();

        ChSparsityPatternLearner sparsity_pattern(nv, nv);
        sysd.ConvertToMatrixForm(&sparsity_pattern, 0); 
        sparsity_pattern.Apply(H);
        sysd.ConvertToMatrixForm(&H,&k);  
        LS_solver->A() = H; 
        LS_solver->b() = k; 

        m_timer_convert.stop();
        if (this->verbose) GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

        // v = H\k
        LS_solver->SetupCurrent();
        LS_solver->SolveCurrent();

        //v = LS_solver->x();
        sysd.FromVectorToVariables(LS_solver->x());

        return 0;
    }
        
    ChSparseMatrix Cq(nc,nv);
    ChSparseMatrix E(nc,nc);
    ChVectorDynamic<> k(nv);
    ChVectorDynamic<> b(nc);

    ChSparseMatrix    A(nv+nc,nv+nc);
    ChVectorDynamic<> B(nv+nc);

    ChVectorDynamic<> l(nc);
    ChVectorDynamic<> z(nc);
    ChVectorDynamic<> y(nc);

    ChVectorDynamic<> l_old(nc);
    ChVectorDynamic<> z_old(nc);
    ChVectorDynamic<> y_old(nc);
    ChVectorDynamic<> v_old(nv);
    
    sysd.ConvertToMatrixForm(&Cq, 0, &E, &k, &b, 0);
    Cq.makeCompressed();
    E.makeCompressed();

    if (!this->m_warm_start) {
        l.setZero();
        z.setZero();
        y.setZero();

        //***TODO**? or just accept approximation?
        //v = M\(k + D*l); % PERFORMANCE HIT, only needed if truncating Nesterov before convergence
        v.setZero(); // enough approx? or better sysd.FromVariablesToVector(v, false); ?
    }
    else
    {
        // warmstarted l:
        sysd.FromConstraintsToVector(l, false);

        // warmstarted v:
        //v = H\(k + D*l); // PERFORMANCE HIT, probably better reuse last v if possible..
        sysd.FromVariablesToVector(v, false); // this works supposing that variables have been warmstarted with "v" too, otherwise:  

        // warmstarted y:
        // the following correct only if r_dual was approx.=0. //***TODO*** as parameter
        y = - (Cq*v - E*l + b); //  dual residual exploiting the kkt form instead of - (N*l+r), faster!
            
        /*
        GetLog() << "Y warmastarted:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
        */
        
        // warmstarted z:
        z = l; //  warm start also this - should project? //***TODO*** as parameter
        //sysd.ConstraintsProject(z);

    }

    ChVectorDynamic<> S(nc);

    if (this->precond == true) {
        // Compute diagonal values of N , only mass effect, neglecting stiffness for the moment, TODO
        //  g_i=[Cq_i]*[invM_i]*[Cq_i]' 
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Update_auxiliary();

        // Average all g_i for the triplet of contact constraints n,u,v.
        int j_friction_comp = 0;
        double gi_values[3];
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
                j_friction_comp++;
                if (j_friction_comp == 3) {
                    double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                    mconstraints[ic - 2]->Set_g_i(average_g_i);
                    mconstraints[ic - 1]->Set_g_i(average_g_i);
                    mconstraints[ic - 0]->Set_g_i(average_g_i);
                    j_friction_comp = 0;
                }
            }
        }
        // The vector with the diagonal of the N matrix
        S.setZero();
        int d_i = 0;
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive()) {
                S(d_i, 0) = sqrt(mconstraints[ic]->Get_g_i());  // square root of diagonal of N, just mass matrices considered, no stiffness matrices anyway
                ++d_i;
            }
        // Now we should scale Cq, E, b as
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        
        // but to avoid storing Cq and E and assembly in A, we postpone this by scaling the entire A matrix later via a IS*A*IS operation
        
        // b = diag(S)*b;
        b = b.cwiseProduct(S);

        // warm started values must be scaled too
        l = l.cwiseQuotient(S); // from l to \breve{l}
        z = z.cwiseQuotient(S); 
        y = y.cwiseProduct(S);

    }
    else {
        S.setConstant(1);
    }  

    // vsigma = ones(nconstr,1)*sigma;
    ChVectorDynamic<> vsigma(nc); // not needed
    vsigma.setConstant(this->sigma);
    

    // vrho = ones(nconstr,1)*rho;
    ChVectorDynamic<> vrho(nc);
    vrho.setConstant(rho_i);

    // vrho(fric==-2) = rho_b;          // special step for bilateral joints
    int s_c = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive()) {
            if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                vrho(s_c) = rho_b;
            s_c++;
        }
    }
 
    // FACTORIZATION
    //
    // A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    
    m_timer_convert.start();

    LS_solver->A().resize(nv + nc, nv + nc); // otherwise conservativeResize in ConvertToMatrixForm() causes error

    //sysd.ConvertToMatrixForm(&LS_solver->A(),&LS_solver->b());  // A = [M, Cq'; Cq, E ];
    // much faster to fill brand new sparse matrices??!!
    ChSparsityPatternLearner sparsity_pattern(nv + nc, nv + nc);
    sysd.ConvertToMatrixForm(&sparsity_pattern, nullptr);
    sparsity_pattern.Apply(A);

    sysd.ConvertToMatrixForm(&A,&B);  // A = [M, Cq'; Cq, E ]; 

    if (this->precond) {
        // the following is equivalent to having scaled 
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        ChVectorDynamic<> IS(nv + nc);
        IS << Eigen::VectorXd::Ones(nv) , S;
        A = IS.asDiagonal() * A * IS.asDiagonal();
        B = IS.asDiagonal() * B; // not needed? B here only factorization...
    }

    LS_solver->A() = A; 
    LS_solver->b() = B; 

    for (int i = 0; i < nc; ++i)
        LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));  //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    m_timer_convert.stop();
    if (this->verbose) GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

    m_timer_factorize.start();
                
    LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

    m_timer_factorize.stop();
    if (this->verbose) GetLog() << " Time for factorize : << " << m_timer_factorize.GetTimeSecondsIntermediate() << "s\n";

    /*
    res_story.r_prim=zeros(1,1);
    res_story.r_dual_Nlry=zeros(1,1);
    res_story.r_dual=zeros(1,1);
    res_story.r_combined_pre=zeros(1,1);
    res_story.r_combined=zeros(1,1);
    res_story.r_deltal=zeros(1,1);
    res_story.r_rho=zeros(1,1);
    res_story.r_violation=zeros(1,1);
    */

    for (int iter = 0; iter < m_max_iterations; iter++) {

        // diagnostic
        l_old = l;
        z_old = z;
        y_old = y;
        v_old = v;

        // Z  u

        // z = project_orthogonal( l + y./vrho,  fric);
        z = l + y.cwiseQuotient(vrho);
        sysd.ConstraintsProject(z); 


        // X   (lambda)

        // SOLVE LINEAR SYSTEM HERE
        // ckkt = -bkkt + (vsigma+vrho).*z - y;
        
        ChVectorDynamic<> ckkt = -b + (vsigma + vrho).cwiseProduct(z) - y;
        LS_solver->b() << k, ckkt;         // B = [k;ckkt];
        
        m_timer_solve.start();

        LS_solver->SolveCurrent();                                                      // LU forward/backsolve ++++++++++++++++++++++++++++++++++++++
        
        m_timer_solve.stop();
        if (this->verbose) GetLog() << " Time for solve : << " << m_timer_solve.GetTimeSecondsIntermediate() << "s\n";

        // x = dA\B;      // A* x = B  with x = [v, -l]    
        l = -LS_solver->x().block(nv, 0, nc, 1);
        v =  LS_solver->x().block(0, 0, nv, 1);
        

        // Y

        y = y + vrho.asDiagonal() * (l - z); 


        // Compute residuals for tolerances
        /*
        r_prim         = norm((z-l).*S, inf);
        r_prim_pre     = norm((z-l)   , inf); 
        r_dual_Nlry    = norm((D'*v-E*l+bkkt+y)./S,inf); % dual residual exploiting the kkt form instead of (N*l+r+y)./S, faster!
        r_dual_Nlry_pre= norm((D'*v-E*l+bkkt+y)   ,inf); % note: does not coincide with r_dual as in plain ADMM, discover why
        r_dual         = norm((vrho.*(l-l_old))./S,inf); % for order is Z-X-Y , different than in plain ADMM X-Z-Y - BUT NOT AFTER NESTEROV CORRECTION!
        r_dual_pre     = norm((vrho.*(l-l_old))   ,inf);
        r_combined     = norm((z-l).*S, 2) +  norm((l-l_old).*S, 2); % combined res. in original metric
        r_combined_pre = norm((z-l)   , 2) +  norm((l-l_old)    ,2); % combined res. in precond.metric
        */
        r_prim = ((z - l).cwiseProduct(S)).lpNorm<Eigen::Infinity>();     //r_prim     = norm((z - l).*S, inf);   
        double r_prim_pre = (z - l).lpNorm<Eigen::Infinity>();              //r_prim_pre = norm((z - l)   , inf); 

        r_dual = (((l - l_old).cwiseProduct(vrho)).cwiseQuotient(S)).lpNorm<Eigen::Infinity>(); // r_dual = norm((vrho.*(l - l_old)). / S, inf); % even faster!See book of Boyd.But coincides only for alpha = 1 !!!
        double r_dual_pre = ((l - l_old).cwiseProduct(vrho)).lpNorm<Eigen::Infinity>();  // r_dual_pre     = norm((vrho.*(l - l_old))   ,inf); 

        //r_combined = norm((z - l).*S, 2) + norm((l - l_old). / S, 2);% combined res.in original metric
        //r_combined_pre = norm((z - l), 2) + norm((l - l_old), 2);% combined res.in precond.metric



        if (this->verbose)
            GetLog() << "ADMMfast iter=" << iter << " prim=" << r_prim << " dual=" << r_dual << "  rho=" << rho_i << " alpha=" << nalpha << "  tols=" << this->tol_prim << " " << this->tol_dual <<  "\n";

        // For recording into violation history, if debugging
        if (this->record_violation_history) {
            // combined residual 
            //double r_combined = ((z - l).cwiseProduct(S)).norm() + ((l - l_old).cwiseQuotient(S)).norm();
            //double r_combined_pre = (z - l).norm() + (l - l_old).norm(); //combined res.in precond.metric
            double c_k_p = (1 / rho) * (y - y_old).norm() + rho * (l - l_old).norm();
            AtIterationEnd(c_k_p, (l - l_old).norm(), iter);
        }
        
        // Termination:
        if ((r_prim < this->tol_prim) && (r_dual < this->tol_dual)) {
            if (this->verbose)
                GetLog() << "ADMMfast converged ok! at iter=" << iter << "\n";
            break;
        }

        // Nesterov acceleration
        if (iter > 1) {
            double c_k_p = (1 / rho) * (y - y_old).norm() + rho * (l - l_old).norm();
            if (c_k_p < eta * c_k) {
                double nalpha_p = (1.0 + sqrt(1.0 + 4 * pow(nalpha,2))) / (2.0);
                l = l + ((nalpha - 1.0) / (nalpha_p)) * (l - l_old);
                v = v + ((nalpha - 1.0) / (nalpha_p)) * (v - v_old); // trick to avoid recomputing it at the end
                y = y + ((nalpha - 1.0) / (nalpha_p)) * (y - y_old);
                nalpha = nalpha_p;
                c_k = c_k_p;
            }
            else{
                if (this->verbose) GetLog() << "ADMMfast Nesterov restart." << iter << "\n";
                nalpha = 1.0;
                c_k = (1 / eta) * c_k_p;
            }
        }


        // once in a while update the rho step parameter
        if ((iter % this->stepadjust_each) == 0) {

            double rhofactor = 1; // default do not shrink / enlarge

            if (this->stepadjust_type == AdmmStepType::NONE) {
                rhofactor = 1.;
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_UNSCALED) {
                rhofactor = sqrt(r_prim_pre / r_dual_pre);
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_FAST) {
                double r_prim_scaled = r_prim_pre / (ChMax(z.lpNorm<Eigen::Infinity>(), l.lpNorm<Eigen::Infinity>()) + 1e-10); // maybe norm(l, inf) very similar to norm(z, inf)
                double r_dual_scaled = r_dual_pre / (y.lpNorm<Eigen::Infinity>() + 1e-10);  //  as in "ADMM Penalty Parameter Selection by Residual Balancing", Brendt Wohlberg
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_RANGE) {
                double r_prim_scaled = r_prim / this->tol_prim;
                double r_dual_scaled = r_dual / this->tol_dual;
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }


            // safeguards against extreme shrinking
            if (rhofactor < 1.0 / this->stepadjust_maxfactor) {
                rhofactor = 1.0 / this->stepadjust_maxfactor;
            }
            if (rhofactor > this->stepadjust_maxfactor) {
                rhofactor = this->stepadjust_maxfactor;
            }

            if ((rhofactor > this->stepadjust_threshold) || (rhofactor < 1.0 / this->stepadjust_threshold)) {

                ChTimer<> m_timer_refactorize;
                m_timer_refactorize.start();

                // Avoid rebuilding all sparse matrix: 
                // A) just remove old rho with -= :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) -= -(sigma + vrho(i));  

                // Update rho
                rho_i = rho_i * rhofactor;

                // vrho(fric == -2) = rho_b; //  special step for bilateral joints
                vrho.setConstant(rho_i);
                s_c = 0;
                for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
                    if (mconstraints[ic]->IsActive()) {
                        if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                            vrho(s_c) = rho_b;
                        s_c++;
                    }
                }

                // UPDATE FACTORIZATION
                //
                //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];
                //
                // To avoid rebuilding A, we just removed the rho step from the diagonal in A), and now: 
                // B) add old rho with += :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));  

                LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

                m_timer_refactorize.stop();
                if (this->verbose) GetLog() << " Time for re-factorize : << " << m_timer_refactorize.GetTimeSecondsIntermediate() << "s\n";
            }

        } // end step adjust


    } // end iteration

    l = l.cwiseProduct(S);

    /*
    GetLog() << "Y resulting:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
    */

    sysd.FromVectorToConstraints(l);
    sysd.FromVectorToVariables(v);

    return r_dual;
}